

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterValidator.cpp
# Opt level: O2

Result * CoreML::validateDoubleParameter
                   (Result *__return_storage_ptr__,string *parameterName,
                   DoubleParameter *doubleParameter)

{
  double __val;
  DoubleRange *pDVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string err;
  string local_38;
  
  if (doubleParameter->_oneof_case_[0] == 10) {
    __val = doubleParameter->defaultvalue_;
    pDVar1 = Specification::DoubleParameter::range(doubleParameter);
    if ((__val < pDVar1->minvalue_) || (pDVar1->maxvalue_ <= __val && __val != pDVar1->maxvalue_)) {
      std::__cxx11::to_string(&local_38,__val);
      std::operator+(&local_b8,"Specified Default Value (",&local_38);
      std::operator+(&local_98,&local_b8,") out of Allowed Value Range for \'");
      std::operator+(&local_78,&local_98,parameterName);
      std::operator+(&err,&local_78,"\'");
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_38);
      Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
      std::__cxx11::string::~string((string *)&err);
      return __return_storage_ptr__;
    }
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result CoreML::validateDoubleParameter(const std::string& parameterName, const Specification::DoubleParameter& doubleParameter) {

    const ::google::protobuf::double_t defaultValue = doubleParameter.defaultvalue();

    if (doubleParameter.has_range()) {
        const Specification::DoubleRange& range = doubleParameter.range();

        if (defaultValue < range.minvalue() || defaultValue > range.maxvalue()) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") out of Allowed Value Range for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }

    return Result();
}